

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool __thiscall FlowGraph::Dominates(FlowGraph *this,Region *region1,Region *region2)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  int iVar5;
  
  if (region1 == (Region *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x3f,"(region1)","region1");
    if (!bVar2) goto LAB_004140fd;
    *puVar4 = 0;
  }
  if (region2 == (Region *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x40,"(region2)","region2");
    if (!bVar2) {
LAB_004140fd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  iVar3 = 0;
  iVar5 = 0;
  if (region1 != (Region *)0x0) {
    iVar5 = 0;
    do {
      iVar5 = iVar5 + 1;
      region1 = region1->parent;
    } while (region1 != (Region *)0x0);
  }
  if (region2 != (Region *)0x0) {
    iVar3 = 0;
    do {
      iVar3 = iVar3 + 1;
      region2 = region2->parent;
    } while (region2 != (Region *)0x0);
  }
  return iVar3 < iVar5;
}

Assistant:

bool FlowGraph::Dominates(Region *region1, Region *region2)
{
    Assert(region1);
    Assert(region2);
    Region *startR1 = region1;
    Region *startR2 = region2;
    int region1Depth = 0;
    while (startR1 != nullptr)
    {
        region1Depth++;
        startR1 = startR1->GetParent();
    }
    int region2Depth = 0;
    while (startR2 != nullptr)
    {
        region2Depth++;
        startR2 = startR2->GetParent();
    }
    return region1Depth > region2Depth;
}